

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::handleRankDeficiency(HEkk *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  reference pvVar4;
  uint *puVar5;
  reference pvVar6;
  long in_RDI;
  HighsInt row_out;
  HighsInt variable_out;
  HighsInt variable_in;
  HighsInt row_in;
  HighsInt k;
  vector<int,_std::allocator<int>_> *var_with_no_pivot;
  vector<int,_std::allocator<int>_> *row_with_no_pivot;
  HighsInt rank_deficiency;
  HFactor *factor;
  uint local_74;
  char *local_68;
  uint uVar7;
  HighsInt in_stack_ffffffffffffffb8;
  value_type row_out_00;
  uint uVar8;
  uint local_34;
  
  iVar1 = *(int *)(in_RDI + 0x2b78);
  this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x2b80);
  this_01 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x2bb0);
  for (local_34 = 0; (int)local_34 < iVar1; local_34 = local_34 + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)(int)local_34);
    iVar2 = *pvVar4;
    iVar3 = *(int *)(in_RDI + 0x2198) + iVar2;
    puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)(int)local_34)
    ;
    uVar7 = *puVar5;
    pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x2990),
                        (long)iVar3);
    *pvVar6 = '\0';
    pvVar6 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0x2990),
                        (long)(int)uVar7);
    *pvVar6 = '\x01';
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)(int)local_34);
    row_out_00 = *pvVar4;
    if ((int)uVar7 < *(int *)(in_RDI + 0x2198)) {
      local_68 = " column";
    }
    else {
      local_68 = "logical";
    }
    local_74 = uVar7;
    if (*(int *)(in_RDI + 0x2198) <= (int)uVar7) {
      local_74 = uVar7 - *(int *)(in_RDI + 0x2198);
    }
    uVar8 = uVar7;
    highsLogDev((HighsLogOptions *)(*(long *)(in_RDI + 8) + 0x380),kInfo,
                "HEkk::handleRankDeficiency: %4d: Basic row of leaving variable (%4d is %s %4d) is %4d; Entering logical = %4d is variable %d)\n"
                ,(ulong)local_34,(ulong)uVar7,local_68,local_74,row_out_00,iVar2,iVar3);
    addBadBasisChange((HEkk *)CONCAT44(iVar3,uVar8),row_out_00,in_stack_ffffffffffffffb8,
                      (HighsInt)((ulong)in_RDI >> 0x20),(BadBasisChangeReason)in_RDI,
                      SUB41(uVar7 >> 0x18,0));
  }
  *(undefined1 *)(in_RDI + 0x2555) = 0;
  return;
}

Assistant:

void HEkk::handleRankDeficiency() {
  HFactor& factor = simplex_nla_.factor_;
  HighsInt rank_deficiency = factor.rank_deficiency;
  vector<HighsInt>& row_with_no_pivot = factor.row_with_no_pivot;
  vector<HighsInt>& var_with_no_pivot = factor.var_with_no_pivot;
  for (HighsInt k = 0; k < rank_deficiency; k++) {
    HighsInt row_in = row_with_no_pivot[k];
    HighsInt variable_in = lp_.num_col_ + row_in;
    HighsInt variable_out = var_with_no_pivot[k];
    basis_.nonbasicFlag_[variable_in] = kNonbasicFlagFalse;
    basis_.nonbasicFlag_[variable_out] = kNonbasicFlagTrue;
    HighsInt row_out = row_with_no_pivot[k];
    assert(basis_.basicIndex_[row_out] == variable_in);
    highsLogDev(
        options_->log_options, HighsLogType::kInfo,
        "HEkk::handleRankDeficiency: %4d: Basic row of leaving variable (%4d "
        "is %s %4d) is "
        "%4d; Entering logical = %4d is variable %d)\n",
        (int)k, (int)variable_out,
        variable_out < lp_.num_col_ ? " column" : "logical",
        variable_out < lp_.num_col_ ? (int)variable_out
                                    : (int)(variable_out - lp_.num_col_),
        (int)row_out, (int)(row_in), (int)variable_in);
    // NB Parameters row_out, variable_in, variable_out, since
    // variable_in is the logical that must not come out to be
    // replaced by the structural variable_out
    addBadBasisChange(row_out, variable_in, variable_out,
                      BadBasisChangeReason::kSingular, true);
  }
  status_.has_ar_matrix = false;
}